

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

void start_scope(LinearizerState *linearizer,Proc *proc,Scope *scope)

{
  ravitype_t type;
  uint uVar1;
  long lVar2;
  int iVar3;
  Proc *sym;
  Scope *pSVar4;
  uint uVar5;
  ulong uVar6;
  PtrListIterator symiter__;
  PtrListIterator local_30;
  
  (linearizer->C_declarations).pos = (size_t)proc;
  raviX_ptrlist_forward_iterator(&local_30,*(PtrList **)&proc->id);
  sym = (Proc *)raviX_ptrlist_iter_next(&local_30);
  if (sym == (Proc *)0x0) {
    return;
  }
LAB_001177fc:
  if (sym->node_count == 0) {
    if ((((ulong)sym->function_expr & 3) != 0) ||
       ((type = *(ravitype_t *)&sym->nodes, type != RAVI_TNUMFLT && (type != RAVI_TNUMINT)))) {
      uVar5 = 3;
      iVar3 = -0x101;
LAB_00117817:
      if ((&linearizer[1].current_proc)[uVar5] == (Proc *)0x0) goto code_r0x00117823;
      uVar6 = (ulong)(&linearizer[1].current_proc)[uVar5] >> 1;
      if (uVar6 == 0) {
        uVar5 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar5 = (uint)lVar2 ^ 0x3f;
      }
      uVar5 = -(uVar5 + iVar3);
      goto LAB_0011786e;
    }
    pSVar4 = (Scope *)allocate_temp_pseudo((Proc *)linearizer,type,true);
    sym->current_scope = pSVar4;
    ((anon_union_40_9_1ec7a544_for_Pseudo_3 *)&pSVar4->parent)->proc = sym;
  }
  goto LAB_0011789c;
code_r0x00117823:
  uVar5 = uVar5 - 1;
  iVar3 = iVar3 + 0x40;
  if (iVar3 == -1) goto code_r0x0011782d;
  goto LAB_00117817;
code_r0x0011782d:
  uVar5 = 0;
LAB_0011786e:
  (&linearizer[1].current_proc)[uVar5 >> 6] =
       (Proc *)((ulong)(&linearizer[1].current_proc)[uVar5 >> 6] | 1L << ((byte)uVar5 & 0x3f));
  uVar1 = (uint)linearizer[1].C_declarations.pos;
  if (uVar1 < uVar5) {
    __assert_fail("reg <= generator->max_reg",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xac,"unsigned int pseudo_gen_alloc(PseudoGenerator *, _Bool)");
  }
  if (uVar5 == uVar1) {
    *(uint *)&linearizer[1].C_declarations.pos = uVar1 + 1;
  }
  allocate_symbol_pseudo((Proc *)linearizer,(LuaSymbol *)sym,uVar5 & 0xff);
LAB_0011789c:
  sym = (Proc *)raviX_ptrlist_iter_next(&local_30);
  if (sym == (Proc *)0x0) {
    return;
  }
  goto LAB_001177fc;
}

Assistant:

static void start_scope(LinearizerState *linearizer, Proc *proc, Scope *scope)
{
	proc->current_scope = scope;
	LuaSymbol *sym;
	FOR_EACH_PTR(scope->symbol_list, LuaSymbol, sym)
	{
		if (sym->symbol_type == SYM_LOCAL) {
			uint8_t reg;
			if (!sym->variable.escaped && !sym->variable.function_parameter &&
			    (sym->variable.value_type.type_code == RAVI_TNUMFLT ||
			     sym->variable.value_type.type_code == RAVI_TNUMINT)) {
				Pseudo *pseudo;
				if (sym->variable.value_type.type_code == RAVI_TNUMFLT)
					pseudo = allocate_temp_pseudo(proc, RAVI_TNUMFLT, true);
				else
					pseudo = allocate_temp_pseudo(proc, RAVI_TNUMINT, true);
				sym->variable.pseudo = pseudo;
				pseudo->temp_for_local = sym; /* Note that this temp is for a local */
			}
			else {
				reg = allocate_register(&proc->local_pseudos, true);
				allocate_symbol_pseudo(proc, sym, reg);
			}
		}
	}
	END_FOR_EACH_PTR(sym)
}